

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# y4minput.c
# Opt level: O2

void y4m_convert_411_420jpeg(y4m_input *_y4m,uchar *_dst,uchar *_aux)

{
  long lVar1;
  int iVar2;
  int _c_h;
  long lVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  byte *pbVar8;
  int iVar9;
  ulong uVar10;
  byte *pbVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  int _c_w;
  ulong uVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  uchar *_src;
  int iVar19;
  uchar *local_98;
  
  iVar2 = _y4m->pic_w;
  _c_h = _y4m->pic_h;
  local_98 = _dst + _c_h * iVar2;
  iVar5 = (iVar2 + _y4m->src_c_dec_h + -1) / _y4m->src_c_dec_h;
  _c_w = (iVar2 + _y4m->dst_c_dec_h + -1) / _y4m->dst_c_dec_h;
  iVar2 = _y4m->dst_c_dec_v;
  _src = _aux + _c_h * iVar5 * 2;
  lVar14 = (long)iVar5;
  lVar1 = lVar14 + -1;
  iVar19 = (int)lVar1;
  iVar18 = 1;
  iVar6 = 1;
  if (iVar19 < 1) {
    iVar6 = iVar19;
  }
  lVar3 = 2;
  if (iVar19 < 2) {
    lVar3 = lVar1;
  }
  uVar4 = (ulong)(0 < iVar5);
  iVar7 = 0;
  if (0 < _c_h) {
    iVar7 = _c_h;
  }
  for (; iVar18 != 3; iVar18 = iVar18 + 1) {
    pbVar8 = _aux + uVar4;
    for (iVar9 = 0; iVar9 != iVar7; iVar9 = iVar9 + 1) {
      for (uVar10 = 0; pbVar11 = pbVar8, lVar13 = uVar4 << 0x21, uVar15 = uVar4,
          iVar12 = (uint)(0 < iVar5) * 2 + 1, uVar4 != uVar10; uVar10 = uVar10 + 1) {
        iVar12 = (int)((((uint)_aux[iVar6] * 0x12 + (uint)*_aux * 0x6f) - (uint)_aux[(int)lVar3]) +
                      0x40) >> 7;
        if (0xfe < iVar12) {
          iVar12 = 0xff;
        }
        if (iVar12 < 1) {
          iVar12 = 0;
        }
        _src[uVar10 * 2] = (uchar)iVar12;
        iVar12 = (int)((uint)_aux[(int)lVar3] * -5 + (uint)_aux[iVar6] * 0x56 + (uint)*_aux * 0x2f +
                      0x40) >> 7;
        if (0xfe < iVar12) {
          iVar12 = 0xff;
        }
        if (iVar12 < 1) {
          iVar12 = 0;
        }
        _src[uVar10 * 2 + 1] = (uchar)iVar12;
      }
      for (; (long)uVar15 < (long)(iVar5 + -2); uVar15 = uVar15 + 1) {
        iVar16 = (int)((((uint)_aux[uVar15 + 1] * 0x12 +
                        (uint)_aux[uVar15] * 0x6e + (uint)_aux[uVar15 - 1]) - (uint)_aux[uVar15 + 2]
                       ) + 0x40) >> 7;
        if (0xfe < iVar16) {
          iVar16 = 0xff;
        }
        if (iVar16 < 1) {
          iVar16 = 0;
        }
        _src[lVar13 >> 0x20] = (uchar)iVar16;
        iVar16 = (int)((uint)_aux[uVar15 + 1] * 0x56 +
                       (uint)_aux[uVar15] * 0x32 + (uint)_aux[uVar15 - 1] * -3 +
                       (uint)_aux[uVar15 + 2] * -5 + 0x40) >> 7;
        if (0xfe < iVar16) {
          iVar16 = 0xff;
        }
        if (iVar16 < 1) {
          iVar16 = 0;
        }
        _src[iVar12] = (uchar)iVar16;
        pbVar11 = pbVar11 + 1;
        lVar13 = lVar13 + 0x200000000;
        iVar12 = iVar12 + 2;
      }
      for (; (long)uVar15 < lVar14; uVar15 = uVar15 + 1) {
        iVar16 = (int)uVar15 + 1;
        if (iVar19 <= iVar16) {
          iVar16 = iVar19;
        }
        iVar17 = (int)((((uint)*pbVar11 * 0x6e + (uint)pbVar11[-1] + (uint)_aux[iVar16] * 0x12) -
                       (uint)_aux[lVar1]) + 0x40) >> 7;
        if (0xfe < iVar17) {
          iVar17 = 0xff;
        }
        if (iVar17 < 1) {
          iVar17 = 0;
        }
        _src[lVar13 >> 0x20] = (uchar)iVar17;
        if (iVar12 < _c_w) {
          iVar16 = (int)((uint)_aux[lVar1] * -5 +
                         (uint)_aux[iVar16] * 0x56 + (uint)*pbVar11 * 0x32 + (uint)pbVar11[-1] * -3
                        + 0x40) >> 7;
          if (0xfe < iVar16) {
            iVar16 = 0xff;
          }
          if (iVar16 < 1) {
            iVar16 = 0;
          }
          _src[iVar12] = (uchar)iVar16;
        }
        iVar12 = iVar12 + 2;
        lVar13 = lVar13 + 0x200000000;
        pbVar11 = pbVar11 + 1;
      }
      _src = _src + _c_w;
      _aux = _aux + lVar14;
      pbVar8 = pbVar8 + lVar14;
    }
    _src = _src + -(long)(_c_w * _c_h);
    y4m_422jpeg_420jpeg_helper(local_98,_src,_c_w,_c_h);
    local_98 = local_98 + ((_c_h + iVar2 + -1) / iVar2) * _c_w;
  }
  return;
}

Assistant:

static void y4m_convert_411_420jpeg(y4m_input *_y4m, unsigned char *_dst,
                                    unsigned char *_aux) {
  unsigned char *tmp;
  int c_w;
  int c_h;
  int c_sz;
  int dst_c_w;
  int dst_c_h;
  int dst_c_sz;
  int tmp_sz;
  int pli;
  int y;
  int x;
  /*Skip past the luma data.*/
  _dst += _y4m->pic_w * _y4m->pic_h;
  /*Compute the size of each chroma plane.*/
  c_w = (_y4m->pic_w + _y4m->src_c_dec_h - 1) / _y4m->src_c_dec_h;
  c_h = _y4m->pic_h;
  dst_c_w = (_y4m->pic_w + _y4m->dst_c_dec_h - 1) / _y4m->dst_c_dec_h;
  dst_c_h = (_y4m->pic_h + _y4m->dst_c_dec_v - 1) / _y4m->dst_c_dec_v;
  c_sz = c_w * c_h;
  dst_c_sz = dst_c_w * dst_c_h;
  tmp_sz = dst_c_w * c_h;
  tmp = _aux + 2 * c_sz;
  for (pli = 1; pli < 3; pli++) {
    /*In reality, the horizontal and vertical steps could be pipelined, for
       less memory consumption and better cache performance, but we do them
       separately for simplicity.*/
    /*First do horizontal filtering (convert to 422jpeg)*/
    for (y = 0; y < c_h; y++) {
      /*Filters: [1 110 18 -1]/128 and [-3 50 86 -5]/128, both derived from a
         4-tap Mitchell window.*/
      for (x = 0; x < OC_MINI(c_w, 1); x++) {
        tmp[x << 1] = (unsigned char)OC_CLAMPI(
            0,
            (111 * _aux[0] + 18 * _aux[OC_MINI(1, c_w - 1)] -
             _aux[OC_MINI(2, c_w - 1)] + 64) >>
                7,
            255);
        tmp[x << 1 | 1] = (unsigned char)OC_CLAMPI(
            0,
            (47 * _aux[0] + 86 * _aux[OC_MINI(1, c_w - 1)] -
             5 * _aux[OC_MINI(2, c_w - 1)] + 64) >>
                7,
            255);
      }
      for (; x < c_w - 2; x++) {
        tmp[x << 1] =
            (unsigned char)OC_CLAMPI(0,
                                     (_aux[x - 1] + 110 * _aux[x] +
                                      18 * _aux[x + 1] - _aux[x + 2] + 64) >>
                                         7,
                                     255);
        tmp[x << 1 | 1] = (unsigned char)OC_CLAMPI(
            0,
            (-3 * _aux[x - 1] + 50 * _aux[x] + 86 * _aux[x + 1] -
             5 * _aux[x + 2] + 64) >>
                7,
            255);
      }
      for (; x < c_w; x++) {
        tmp[x << 1] = (unsigned char)OC_CLAMPI(
            0,
            (_aux[x - 1] + 110 * _aux[x] + 18 * _aux[OC_MINI(x + 1, c_w - 1)] -
             _aux[c_w - 1] + 64) >>
                7,
            255);
        if ((x << 1 | 1) < dst_c_w) {
          tmp[x << 1 | 1] = (unsigned char)OC_CLAMPI(
              0,
              (-3 * _aux[x - 1] + 50 * _aux[x] +
               86 * _aux[OC_MINI(x + 1, c_w - 1)] - 5 * _aux[c_w - 1] + 64) >>
                  7,
              255);
        }
      }
      tmp += dst_c_w;
      _aux += c_w;
    }
    tmp -= tmp_sz;
    /*Now do the vertical filtering.*/
    y4m_422jpeg_420jpeg_helper(_dst, tmp, dst_c_w, c_h);
    _dst += dst_c_sz;
  }
}